

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInserts(DeadInsertElimPass *this,Function *func)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = true;
  bVar2 = false;
  while (bVar1 != false) {
    bVar1 = EliminateDeadInsertsOnePass(this,func);
    bVar2 = (bool)(bVar2 | bVar1);
  }
  return bVar2;
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInserts(Function* func) {
  bool modified = false;
  bool lastmodified = true;
  // Each pass can delete dead instructions, thus potentially revealing
  // new dead insertions ie insertions with no uses.
  while (lastmodified) {
    lastmodified = EliminateDeadInsertsOnePass(func);
    modified |= lastmodified;
  }
  return modified;
}